

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds04_best_bst.cpp
# Opt level: O0

int main(void)

{
  less<int> local_29;
  undefined1 local_28 [8];
  map_bst<int,_int,_std::less<int>_> bst;
  int n;
  int k;
  
  std::istream::operator>>((istream *)&std::cin,(int *)((long)&bst.mSize + 4));
  bst.mSize._0_4_ = (2 << (bst.mSize._4_1_ & 0x1f)) + -1;
  CP::map_bst<int,_int,_std::less<int>_>::map_bst
            ((map_bst<int,_int,_std::less<int>_> *)local_28,&local_29);
  gen_best_bst((int)bst.mSize,(map_bst<int,_int,_std::less<int>_> *)local_28);
  CP::map_bst<int,_int,_std::less<int>_>::print_key_preorder
            ((map_bst<int,_int,_std::less<int>_> *)local_28);
  CP::map_bst<int,_int,_std::less<int>_>::print_key_inorder
            ((map_bst<int,_int,_std::less<int>_> *)local_28);
  CP::map_bst<int,_int,_std::less<int>_>::print_key_postorder
            ((map_bst<int,_int,_std::less<int>_> *)local_28);
  CP::map_bst<int,_int,_std::less<int>_>::~map_bst((map_bst<int,_int,_std::less<int>_> *)local_28);
  return 0;
}

Assistant:

int main() {
  int k;
  int n;
  std::cin >> k;
  n = (2 << k) - 1;
  CP::map_bst<int,int> bst;
  gen_best_bst(n,bst);
  bst.print_key_preorder();
  bst.print_key_inorder();
  bst.print_key_postorder();
}